

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Model::~Model(Model *this)

{
  Model *this_local;
  
  ~Model(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

Model::~Model()
{

}